

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

DOMDocument * __thiscall xercesc_4_0::DOMNodeImpl::getOwnerDocument(DOMNodeImpl *this)

{
  bool bVar1;
  int iVar2;
  DOMNode *p;
  DOMParentNode *pDVar3;
  undefined4 extraout_var;
  DOMNodeImpl *local_60;
  DOMNodeImpl *local_50;
  DOMDocument *local_40;
  DOMDocument *ownerDoc;
  DOMParentNode *parent;
  DOMNode *ep;
  DOMNodeImpl *this_local;
  
  bVar1 = isLeafNode(this);
  if (bVar1) {
    bVar1 = isOwned(this);
    if (bVar1) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      this_local = (DOMNodeImpl *)CONCAT44(extraout_var,iVar2);
      if (this_local == (DOMNodeImpl *)0x0) {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
        if (iVar2 != 9) {
          __assert_fail("fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE",
                        "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeImpl.cpp"
                        ,0xb6,"DOMDocument *xercesc_4_0::DOMNodeImpl::getOwnerDocument() const");
        }
        if (this->fOwnerNode == (DOMNode *)0x0) {
          local_50 = (DOMNodeImpl *)0x0;
        }
        else {
          local_50 = (DOMNodeImpl *)(this->fOwnerNode + -3);
        }
        this_local = local_50;
      }
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
      if (iVar2 != 9) {
        __assert_fail("fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE",
                      "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeImpl.cpp"
                      ,0xbd,"DOMDocument *xercesc_4_0::DOMNodeImpl::getOwnerDocument() const");
      }
      if (this->fOwnerNode == (DOMNode *)0x0) {
        local_60 = (DOMNodeImpl *)0x0;
      }
      else {
        local_60 = (DOMNodeImpl *)(this->fOwnerNode + -3);
      }
      this_local = local_60;
    }
  }
  else {
    getContainingNode(this);
    p = getContainingNode(this);
    pDVar3 = castToParentImpl(p);
    if (pDVar3 == (DOMParentNode *)0x0) {
      local_40 = (DOMDocument *)0x0;
    }
    else {
      local_40 = pDVar3->fOwnerDocument;
    }
    this_local = (DOMNodeImpl *)local_40;
  }
  return (DOMDocument *)this_local;
}

Assistant:

DOMDocument *DOMNodeImpl::getOwnerDocument() const
{
    if (!this->isLeafNode())
    {
        const DOMNode *ep = getContainingNode();
        const DOMParentNode* parent = castToParentImpl(getContainingNode());
        return parent ? parent->fOwnerDocument : 0;
    }

    //  Leaf node types - those that cannot have children, like Text.
    if (isOwned()) {

        DOMDocument* ownerDoc = fOwnerNode->getOwnerDocument();

        if (!ownerDoc) {

            assert (fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE);
            return  (DOMDocument *)fOwnerNode;
        }
        else {
            return ownerDoc;
        }
    } else {
        assert (fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE);
        return  (DOMDocument *)fOwnerNode;
    }
}